

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Index *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Type local_420;
  Type local_3e8;
  double local_3b0;
  IdentityReturnType local_3a8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_390;
  Type local_350;
  Type local_318;
  double local_2e0;
  IdentityReturnType local_2d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_2c0;
  Type local_280;
  Type local_248;
  double local_210;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
  local_203 [3];
  Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_200;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,__1,_0,_6,__1>_>_>
  local_1f0;
  Matrix<double,__1,__1,_0,__1,__1> local_1b8;
  undefined1 local_190 [8];
  Matrix m;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> local_148 [288];
  IdentityReturnType local_28;
  ModelBaseEKFFlexEstimatorIMU *local_10;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  local_10 = this;
  iVar1 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            (&local_28,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->R_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_28);
  getDefaultRIMU();
  this_00 = &m.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<6,6>
            ((Type *)this_00,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,0,0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,6,6,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,6,6,false> *)this_00,local_148);
  (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase[0x44])();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_190);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_190,6,6);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_190);
  getDefaultQ();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->Q_,&local_1b8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1b8);
  if ((this->withUnmodeledForces_ & 1U) == 0) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_280,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x18,0x18,6,6)
    ;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_280);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::Identity();
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>>
    ::operator*(&local_200,local_203,
                (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_190);
    local_210 = 0.01;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
    ::operator*(&local_1f0,
                (MatrixBase<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,6,6,0,6,6>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                 *)&local_200,&local_210);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_248,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x18,0x18,6,6)
    ;
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_248,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,__1,_0,_6,__1>_>_>_>
                *)&local_1f0);
  }
  if ((this->withComBias_ & 1U) == 0) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_350,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x1e,0x1e,2,2)
    ;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_350);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_2d8,2,2);
    local_2e0 = 2.5e-10;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::operator*(&local_2c0,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                 *)&local_2d8,&local_2e0);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_318,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x1e,0x1e,2,2)
    ;
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_318,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_2c0);
  }
  if ((this->withAbsolutePos_ & 1U) == 0) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_420,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x20,0x20,3,3)
    ;
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
    setZero((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &local_420);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_3a8,3,3);
    local_3b0 = 1e-08;
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::operator*(&local_390,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                 *)&local_3a8,&local_3b0);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (&local_3e8,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,0x20,0x20,3,3)
    ;
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_3e8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                *)&local_390);
  }
  KalmanFilterBase::setQ
            (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,&this->Q_);
  (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase[0x3e])();
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_190);
  return;
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices()
{

  /////// std::cout << "\n\n\n ============> RESET COVARIANCE MATRIX <=============== \n\n\n" << std::endl;

  R_ = Matrix::Identity(getMeasurementSize(), getMeasurementSize());
  R_.block<6, 6>(0, 0) = getDefaultRIMU();

  updateMeasurementCovarianceMatrix_();
  stateObservation::Matrix m;
  m.resize(6, 6);
  m.setIdentity();

  Q_ = getDefaultQ();

  if(withUnmodeledForces_)
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6) = Matrix6::Identity() * m * 1.e-2;
  else
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6).setZero();

  if(withComBias_)
    Q_.block(state::comBias, state::comBias, 2, 2) = Matrix::Identity(2, 2) * 2.5e-10;
  else
    Q_.block(state::comBias, state::comBias, 2, 2).setZero();

  if(withAbsolutePos_)
    Q_.block(state::drift, state::drift, 3, 3) = Matrix::Identity(3, 3) * 1e-8;
  else
    Q_.block(state::drift, state::drift, 3, 3).setZero();

  ekf_.setQ(Q_);
  resetStateCovarianceMatrix();
}